

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-store.c
# Opt level: O3

void textui_store_knowledge(store *store)

{
  store_context ctx;
  store_context sStack_118;
  
  screen_save();
  clear_from(L'\0');
  if (store != (store *)0x0) {
    store_menu_init(&sStack_118,store,true);
    menu_select(&sStack_118.menu,0,false);
    event_signal(EVENT_MESSAGE_FLUSH);
    screen_load();
    mem_free(sStack_118.list);
    return;
  }
  prt("You have no home!",L'\x0f',L'\0');
  anykey();
  screen_load();
  return;
}

Assistant:

void textui_store_knowledge(struct store *store)
{
	struct store_context ctx;

	screen_save();
	clear_from(0);

	if (!store) {
		prt("You have no home!", 15, 0);
		anykey();
		screen_load();
		return;
	}

	store_menu_init(&ctx, store, true);
	menu_select(&ctx.menu, 0, false);

	/* Flush messages XXX XXX XXX */
	event_signal(EVENT_MESSAGE_FLUSH);

	screen_load();

	mem_free(ctx.list);
}